

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,AddressType addr_type,ByteData160 *hash,
          AddressFormatData *network_parameter)

{
  AddressFormatData *hash_data;
  uint8_t uVar1;
  CfdException *this_00;
  allocator local_79;
  string local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  allocator local_29;
  AddressFormatData *local_28;
  AddressFormatData *network_parameter_local;
  ByteData160 *hash_local;
  AddressType addr_type_local;
  NetType_conflict type_local;
  Address *this_local;
  
  this->type_ = type;
  this->addr_type_ = addr_type;
  this->witness_ver_ = kVersionNone;
  local_28 = network_parameter;
  network_parameter_local = (AddressFormatData *)hash;
  hash_local._0_4_ = addr_type;
  hash_local._4_4_ = type;
  _addr_type_local = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&this->address_,"",&local_29);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_29);
  ByteData160::GetBytes(&local_58,(ByteData160 *)network_parameter_local);
  ByteData::ByteData(&this->hash_,&local_58);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
  Pubkey::Pubkey(&this->pubkey_);
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_);
  Script::Script(&this->redeem_script_);
  AddressFormatData::AddressFormatData(&this->format_data_,local_28);
  memset(this->checksum_,0,4);
  hash_data = network_parameter_local;
  if ((AddressType)hash_local == kP2pkhAddress) {
    uVar1 = AddressFormatData::GetP2pkhPrefix(local_28);
    CalculateP2PKH(this,(ByteData160 *)hash_data,uVar1);
  }
  else {
    if ((((AddressType)hash_local != kP2shAddress) && ((AddressType)hash_local != kP2shP2wshAddress)
        ) && ((AddressType)hash_local != kP2shP2wpkhAddress)) {
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_78,"Support addressType is p2pkh or p2sh",&local_79);
      CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_78);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    uVar1 = AddressFormatData::GetP2shPrefix(local_28);
    CalculateP2SH(this,(ByteData160 *)hash_data,uVar1);
  }
  return;
}

Assistant:

Address::Address(
    NetType type, AddressType addr_type, const ByteData160& hash,
    const AddressFormatData& network_parameter)
    : type_(type),
      addr_type_(addr_type),
      witness_ver_(kVersionNone),
      address_(""),
      hash_(hash.GetBytes()),
      pubkey_(),
      schnorr_pubkey_(),
      redeem_script_(),
      format_data_(network_parameter) {
  memset(checksum_, 0, sizeof(checksum_));
  if (addr_type == kP2pkhAddress) {
    CalculateP2PKH(hash, network_parameter.GetP2pkhPrefix());
  } else if (
      (addr_type == kP2shAddress) || (addr_type == kP2shP2wshAddress) ||
      (addr_type == kP2shP2wpkhAddress)) {
    CalculateP2SH(hash, network_parameter.GetP2shPrefix());
  } else {
    throw CfdException(
        kCfdIllegalArgumentError, "Support addressType is p2pkh or p2sh");
  }
}